

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O3

void ast_dump_node(FILE *f,_node_t *n,int indent)

{
  node_type_e nVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  size_t __size;
  ulong uVar6;
  
  if (root == n) goto LAB_00103a33;
  fwrite("; ",2,1,(FILE *)f);
  iVar4 = indent;
  if (indent != 0) {
    do {
      fwrite("    ",4,1,(FILE *)f);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  nVar1 = n->type;
  if (nVar1 == ASSIGN) {
    pcVar5 = "assign\n";
    __size = 7;
  }
  else {
    if (nVar1 == FUNCTION) {
      pcVar5 = "FUNCTION %s\n";
LAB_001039bb:
      pcVar3 = n->identifier;
LAB_001039be:
      fprintf((FILE *)f,pcVar5,pcVar3);
      goto LAB_00103a33;
    }
    if (nVar1 == STATEMENT_LIST) {
      uVar2 = n->num_value;
      pcVar5 = "SCOPE %d\n";
LAB_001039a1:
      fprintf((FILE *)f,pcVar5,(ulong)uVar2);
      goto LAB_00103a33;
    }
    switch(n->id) {
    case 0x86:
      pcVar5 = "%s\n";
      goto LAB_001039bb;
    case 0x87:
      uVar2 = n->num_value;
      pcVar5 = "%d\n";
      goto LAB_001039a1;
    default:
      pcVar3 = token_name(n->id);
      pcVar5 = "%s\n";
      goto LAB_001039be;
    case 0x8c:
      pcVar5 = "-ve\n";
      break;
    case 0x8d:
      pcVar5 = "+ve\n";
    }
    __size = 4;
  }
  fwrite(pcVar5,__size,1,(FILE *)f);
LAB_00103a33:
  uVar2 = n->num_children;
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      if (n->children[uVar6] != (_node_t *)0x0) {
        ast_dump_node(f,n->children[uVar6],indent + 1);
        uVar2 = n->num_children;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar2);
  }
  return;
}

Assistant:

void ast_dump_node(FILE* f, _node_t* n, int indent)
{
    unsigned int i;
    if (n != root)
    {
        int ind = indent;
        fprintf(f, "; ");
        while (ind--)
            fprintf(f, "    ");

        if (n->type == STATEMENT_LIST)
        {
            fprintf(f, "SCOPE %d\n", n->num_value);
        }
        else if (n->type == FUNCTION)
        {
            fprintf(f, "FUNCTION %s\n", n->identifier);
        }
        else if (n->type == ASSIGN)
        {
            fprintf(f, "assign\n");
        }
        else if (n->id == IDENTIFIER)
        {
            fprintf(f, "%s\n", n->identifier);
        }
        else if (n->id == CONSTANT)
        {
            fprintf(f, "%d\n", n->num_value);
        }
        else if (n->id == POSITIVE)
        {
            fprintf(f, "+ve\n");
        }
        else if (n->id == NEGATIVE)
        {
            fprintf(f, "-ve\n");
        }
        else
            fprintf(f, "%s\n", token_name(n->id));
    }

    for (i = 0; i < n->num_children; i++)
    {
        if (n->children[i])
            ast_dump_node(f, n->children[i], indent + 1);
    }
}